

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O1

void device_reset_k054539(void *chip)

{
  memset((void *)((long)chip + 0x8f1),0,0x230);
  *(undefined8 *)((long)chip + 0x8d8) = 0;
  *(undefined8 *)((long)chip + 0x8e0) = 0;
  *(undefined8 *)((long)chip + 0x8e8) = 0;
  *(undefined2 *)((long)chip + 0xb30) = 0;
  *(undefined4 *)((long)chip + 0xb34) = 0;
  memset(*(void **)((long)chip + 0xb28),0,0x4000);
  return;
}

Assistant:

static void device_reset_k054539(void *chip)
{
	k054539_state *info = (k054539_state *)chip;
	
	memset(info->regs, 0, sizeof(info->regs));
	memset(info->posreg_latch, 0, sizeof(info->posreg_latch));
	
	info->reverb_pos = 0;
	info->cur_ptr = 0;
	memset(info->ram, 0x00, 0x4000);
	
	return;
}